

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsvg.c
# Opt level: O0

FT_Error find_doc(FT_Byte *document_records,FT_UShort num_entries,FT_UInt glyph_index,
                 FT_ULong *doc_offset,FT_ULong *doc_length,FT_UShort *start_glyph,
                 FT_UShort *end_glyph)

{
  Svg_doc doc;
  Svg_doc doc_00;
  Svg_doc doc_01;
  FT_Int FVar1;
  Svg_doc local_118;
  Svg_doc local_100;
  Svg_doc local_e8;
  Svg_doc local_d0;
  Svg_doc local_b8;
  FT_Int local_9c;
  uint local_98;
  FT_Int comp_res;
  FT_UInt end_index;
  FT_UInt start_index;
  FT_UInt i;
  undefined4 uStack_84;
  FT_Bool found;
  Svg_doc end_doc;
  Svg_doc mid_doc;
  Svg_doc start_doc;
  FT_Error error;
  FT_UShort *start_glyph_local;
  FT_ULong *doc_length_local;
  FT_ULong *doc_offset_local;
  FT_UInt glyph_index_local;
  FT_UShort num_entries_local;
  FT_Byte *document_records_local;
  
  memset(&end_doc.length,0,0x18);
  start_index._3_1_ = '\0';
  end_index = 0;
  comp_res = 0;
  local_98 = num_entries - 1;
  if (num_entries == 0) {
    document_records_local._4_4_ = 8;
  }
  else {
    extract_svg_doc(&local_b8,document_records);
    extract_svg_doc(&local_d0,document_records + local_98 * 0xc);
    i._0_2_ = local_d0.start_glyph_id;
    i._2_2_ = local_d0.end_glyph_id;
    uStack_84 = local_d0._4_4_;
    end_doc.start_glyph_id = (undefined2)local_d0.offset;
    end_doc.end_glyph_id = local_d0.offset._2_2_;
    end_doc._4_4_ = local_d0.offset._4_4_;
    end_doc.offset = local_d0.length;
    doc.offset = local_b8.offset;
    doc.start_glyph_id = local_b8.start_glyph_id;
    doc.end_glyph_id = local_b8.end_glyph_id;
    doc._4_4_ = local_b8._4_4_;
    doc.length = local_b8.length;
    FVar1 = compare_svg_doc(doc,glyph_index);
    if ((FVar1 == -1) ||
       (doc_00.offset._0_2_ = end_doc.start_glyph_id, doc_00.offset._2_2_ = end_doc.end_glyph_id,
       doc_00.offset._4_4_ = end_doc._4_4_, doc_00.start_glyph_id = (FT_UShort)i,
       doc_00.end_glyph_id = i._2_2_, doc_00._4_4_ = uStack_84, doc_00.length = end_doc.offset,
       FVar1 = compare_svg_doc(doc_00,glyph_index), FVar1 == 1)) {
      document_records_local._4_4_ = 0x10;
    }
    else {
      while ((uint)comp_res <= local_98) {
        end_index = comp_res + local_98 >> 1;
        extract_svg_doc(&local_e8,document_records + end_index * 0xc);
        end_doc.length._0_2_ = local_e8.start_glyph_id;
        end_doc.length._2_2_ = local_e8.end_glyph_id;
        end_doc.length._4_4_ = local_e8._4_4_;
        mid_doc.start_glyph_id = (undefined2)local_e8.offset;
        mid_doc.end_glyph_id = local_e8.offset._2_2_;
        mid_doc._4_4_ = local_e8.offset._4_4_;
        mid_doc.offset = local_e8.length;
        doc_01.offset = local_e8.offset;
        doc_01.start_glyph_id = local_e8.start_glyph_id;
        doc_01.end_glyph_id = local_e8.end_glyph_id;
        doc_01._4_4_ = local_e8._4_4_;
        doc_01.length = local_e8.length;
        local_9c = compare_svg_doc(doc_01,glyph_index);
        if (local_9c == 1) {
          comp_res = end_index + 1;
          extract_svg_doc(&local_100,document_records + (uint)(comp_res * 4));
        }
        else {
          if (local_9c != -1) {
            start_index._3_1_ = '\x01';
            break;
          }
          local_98 = end_index - 1;
          extract_svg_doc(&local_118,document_records + local_98 * 4);
          i._0_2_ = local_118.start_glyph_id;
          i._2_2_ = local_118.end_glyph_id;
          uStack_84 = local_118._4_4_;
          end_doc.start_glyph_id = (undefined2)local_118.offset;
          end_doc.end_glyph_id = local_118.offset._2_2_;
          end_doc._4_4_ = local_118.offset._4_4_;
          end_doc.offset = local_118.length;
        }
      }
      if (start_index._3_1_ == '\x01') {
        *doc_offset = mid_doc._0_8_;
        *doc_length = mid_doc.offset;
        *start_glyph = (FT_UShort)end_doc.length;
        *end_glyph = end_doc.length._2_2_;
        start_doc.length._4_4_ = 0;
      }
      else {
        start_doc.length._4_4_ = 0x10;
      }
      document_records_local._4_4_ = start_doc.length._4_4_;
    }
  }
  return document_records_local._4_4_;
}

Assistant:

static FT_Error
  find_doc( FT_Byte*    document_records,
            FT_UShort   num_entries,
            FT_UInt     glyph_index,
            FT_ULong   *doc_offset,
            FT_ULong   *doc_length,
            FT_UShort  *start_glyph,
            FT_UShort  *end_glyph )
  {
    FT_Error  error;

    Svg_doc  start_doc;
    Svg_doc  mid_doc = { 0, 0, 0, 0 }; /* pacify compiler */
    Svg_doc  end_doc;

    FT_Bool  found = FALSE;
    FT_UInt  i     = 0;

    FT_UInt  start_index = 0;
    FT_UInt  end_index   = num_entries - 1;
    FT_Int   comp_res;


    /* search algorithm */
    if ( num_entries == 0 )
    {
      error = FT_THROW( Invalid_Table );
      return error;
    }

    start_doc = extract_svg_doc( document_records + start_index * 12 );
    end_doc   = extract_svg_doc( document_records + end_index * 12 );

    if ( ( compare_svg_doc( start_doc, glyph_index ) == -1 ) ||
         ( compare_svg_doc( end_doc, glyph_index ) == 1 )    )
    {
      error = FT_THROW( Invalid_Glyph_Index );
      return error;
    }

    while ( start_index <= end_index )
    {
      i        = ( start_index + end_index ) / 2;
      mid_doc  = extract_svg_doc( document_records + i * 12 );
      comp_res = compare_svg_doc( mid_doc, glyph_index );

      if ( comp_res == 1 )
      {
        start_index = i + 1;
        start_doc   = extract_svg_doc( document_records + start_index * 4 );
      }
      else if ( comp_res == -1 )
      {
        end_index = i - 1;
        end_doc   = extract_svg_doc( document_records + end_index * 4 );
      }
      else
      {
        found = TRUE;
        break;
      }
    }
    /* search algorithm end */

    if ( found != TRUE )
    {
      FT_TRACE5(( "SVG glyph not found\n" ));
      error = FT_THROW( Invalid_Glyph_Index );
    }
    else
    {
      *doc_offset = mid_doc.offset;
      *doc_length = mid_doc.length;

      *start_glyph = mid_doc.start_glyph_id;
      *end_glyph   = mid_doc.end_glyph_id;

      error = FT_Err_Ok;
    }

    return error;
  }